

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

string * __thiscall
cfd::core::ScriptElement::ToString_abi_cxx11_(string *__return_storage_ptr__,ScriptElement *this)

{
  ScriptElementType SVar1;
  ScriptType SVar2;
  size_t sVar3;
  allocator local_2d [20];
  allocator local_19;
  ScriptElement *local_18;
  ScriptElement *this_local;
  
  SVar1 = this->type_;
  local_18 = this;
  this_local = (ScriptElement *)__return_storage_ptr__;
  if (SVar1 != kElementOpCode) {
    if (SVar1 == kElementBinary) {
      sVar3 = ByteData::GetDataSize(&this->binary_data_);
      if (sVar3 == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
        return __return_storage_ptr__;
      }
      ByteData::GetHex_abi_cxx11_(__return_storage_ptr__,&this->binary_data_);
      return __return_storage_ptr__;
    }
    if (SVar1 == kElementNumber) {
      ::std::__cxx11::to_string(__return_storage_ptr__,this->value_);
      return __return_storage_ptr__;
    }
  }
  SVar2 = ScriptOperator::GetDataType(&this->op_code_);
  if (SVar2 == kOpInvalidOpCode) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_2d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else {
    ScriptOperator::ToString_abi_cxx11_(__return_storage_ptr__,&this->op_code_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptElement::ToString() const {
  switch (type_) {
    case kElementBinary:
      if (binary_data_.GetDataSize() == 0) {
        return "";
      } else {
        return binary_data_.GetHex();
      }
    case kElementNumber: {
      return std::to_string(value_);
    }
    case kElementOpCode:
    default: {
      if (op_code_.GetDataType() != kOpInvalidOpCode) {
        return op_code_.ToString();
      }
      break;
    }
  }
  return "";
}